

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix)

{
  pointer pTVar1;
  cmGeneratorTarget *target;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  cmLocalGenerator *lg;
  string *psVar5;
  cmExportBuildFileGenerator *this_00;
  pointer pTVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string importedXcFrameworkLocation;
  string local_130;
  string local_f8;
  ImportPropertyMap properties;
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  pTVar1 = (this->Exports).
           super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = this;
  for (pTVar6 = (this->Exports).
                super__Vector_base<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
    target = pTVar6->Target;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &properties._M_t._M_impl.super__Rb_tree_header._M_header;
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    TVar4 = GetExportTargetType(this_00,target);
    if (TVar4 != INTERFACE_LIBRARY) {
      SetImportLocationProperty(this_00,config,suffix,target,&properties);
    }
    if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TVar4 = GetExportTargetType(this_00,target);
      if (TVar4 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,&properties);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,target,
                   &properties);
      }
      importedXcFrameworkLocation._M_dataplus._M_p = (pointer)&importedXcFrameworkLocation.field_2;
      pcVar2 = (pTVar6->XcFrameworkLocation)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&importedXcFrameworkLocation,pcVar2,
                 pcVar2 + (pTVar6->XcFrameworkLocation)._M_string_length);
      if (importedXcFrameworkLocation._M_string_length != 0) {
        cmGeneratorExpression::Preprocess
                  ((string *)local_98,&importedXcFrameworkLocation,BuildInterface,false);
        std::__cxx11::string::operator=((string *)&importedXcFrameworkLocation,(string *)local_98);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,importedXcFrameworkLocation._M_dataplus._M_p,
                   importedXcFrameworkLocation._M_dataplus._M_p +
                   importedXcFrameworkLocation._M_string_length);
        lg = cmGeneratorTarget::GetLocalGenerator(pTVar6->Target);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_130._M_string_length = 0;
        local_130.field_2._M_allocated_capacity =
             local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
        cmGeneratorExpression::Evaluate
                  ((string *)local_98,&local_f8,lg,config,pTVar6->Target,
                   (cmGeneratorExpressionDAGChecker *)0x0,pTVar6->Target,&local_130);
        std::__cxx11::string::operator=((string *)&importedXcFrameworkLocation,(string *)local_98);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((importedXcFrameworkLocation._M_string_length != 0) &&
           (bVar3 = cmsys::SystemTools::FileIsFullPath(&importedXcFrameworkLocation), !bVar3)) {
          psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
          local_98._8_8_ = (psVar5->_M_dataplus)._M_p;
          local_98._0_8_ = psVar5->_M_string_length;
          local_98._16_8_ = 0;
          local_130._M_dataplus._M_p = (pointer)0x0;
          local_130._M_string_length = 1;
          local_130.field_2._M_allocated_capacity = (long)&local_130.field_2 + 8;
          local_130.field_2._M_local_buf[8] = '/';
          local_98._24_8_ = 1;
          local_70._M_p = (pointer)0x0;
          local_68 = importedXcFrameworkLocation._M_string_length;
          local_60._M_allocated_capacity = (size_type)importedXcFrameworkLocation._M_dataplus._M_p;
          local_60._8_8_ = 0;
          views._M_len = 3;
          views._M_array = (iterator)local_98;
          local_98._32_8_ = local_130.field_2._M_allocated_capacity;
          cmCatViews(&local_50,views);
          std::__cxx11::string::operator=
                    ((string *)&importedXcFrameworkLocation,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,suffix,target,&properties,&importedXcFrameworkLocation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)importedXcFrameworkLocation._M_dataplus._M_p != &importedXcFrameworkLocation.field_2) {
        operator_delete(importedXcFrameworkLocation._M_dataplus._M_p,
                        importedXcFrameworkLocation.field_2._M_allocated_capacity + 1);
      }
    }
    this_00 = (cmExportBuildFileGenerator *)&properties;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_00);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  for (auto const& exp : this->Exports) {
    cmGeneratorTarget* target = exp.Target;

    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = exp.XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::BuildInterface);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, exp.Target->GetLocalGenerator(), config,
          exp.Target, nullptr, exp.Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation)) {
          importedXcFrameworkLocation =
            cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/',
                     importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, target, properties,
                                       importedXcFrameworkLocation);
    }
  }
}